

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

void __thiscall PlayerStrategy::PlayerStrategy(PlayerStrategy *this)

{
  int *piVar1;
  string *psVar2;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_0013d820;
  piVar1 = (int *)operator_new(4);
  *piVar1 = -1;
  this->numWeakest = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->armiesToPlace = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->exchangingCardType = piVar1;
  this->player = (Player *)0x0;
  this->from = (Country *)0x0;
  this->to = (Country *)0x0;
  psVar2 = (string *)operator_new(0x20);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,"ABSTRACT","");
  this->strategyName = psVar2;
  return;
}

Assistant:

PlayerStrategy::PlayerStrategy() {
    this->armiesToPlace = new int(0);
    this->exchangingCardType = new int(0);
    this->player = nullptr;
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string("ABSTRACT");
}